

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall google::protobuf::compiler::python::Generator::PrintImports(Generator *this)

{
  size_type *psVar1;
  string *filename;
  int iVar2;
  FileDescriptor *pFVar3;
  char **ppcVar4;
  ulong uVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  int index;
  long lVar11;
  bool bVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  string module_name;
  string module_alias;
  undefined1 local_138 [32];
  Generator *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pFVar3 = this->file_;
  if (0 < *(int *)(pFVar3 + 0x20)) {
    index = 0;
    local_118 = this;
    do {
      pFVar3 = FileDescriptor::dependency(pFVar3,index);
      filename = *(string **)pFVar3;
      anon_unknown_0::ModuleName(&local_f0,filename);
      anon_unknown_0::ModuleAlias(&local_70,filename);
      local_138._0_8_ = (pointer)0x0;
      local_138._8_8_ = (pointer)0x0;
      local_138._16_8_ = (pointer)0x0;
      SplitStringUsing(&local_f0,".",
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_138);
      bVar12 = local_138._8_8_ != local_138._0_8_;
      if (bVar12) {
        lVar11 = 0;
        uVar10 = 0;
        do {
          ppcVar4 = std::
                    __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((anonymous_namespace)::kKeywords,&ruby::Generator::vtable,
                               (pointer)(local_138._0_8_ + lVar11));
          if (ppcVar4 != (char **)&ruby::Generator::vtable) break;
          uVar10 = uVar10 + 1;
          uVar5 = (long)(local_138._8_8_ - local_138._0_8_) >> 5;
          lVar11 = lVar11 + 0x20;
          bVar12 = uVar10 < uVar5;
        } while (uVar10 < uVar5);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
      this = local_118;
      if (bVar12) {
        io::Printer::Print<>(local_118->printer_,"import importlib\n");
        io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
                  (this->printer_,"$alias$ = importlib.import_module(\'$name$\')\n",
                   (char (*) [6])0x3a48c7,&local_70,(char (*) [5])0x3958cc,&local_f0);
      }
      else {
        iVar2 = std::__cxx11::string::rfind((char)&local_f0,0x2e);
        local_138._0_8_ = local_138 + 0x10;
        local_138._8_8_ = (pointer)0x0;
        local_138._16_8_ = local_138._16_8_ & 0xffffffffffffff00;
        if (iVar2 == -1) {
          std::operator+(&local_110,"import ",&local_f0);
          std::__cxx11::string::operator=((string *)local_138,(string *)&local_110);
          this = local_118;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_110 + 0x10U)) {
            operator_delete(local_110._M_dataplus._M_p);
            this = local_118;
          }
        }
        else {
          std::__cxx11::string::substr((ulong)local_50,(ulong)&local_f0);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3ebd1b);
          local_90 = &local_80;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_80 = *plVar8;
            lStack_78 = plVar6[3];
          }
          else {
            local_80 = *plVar8;
            local_90 = (long *)*plVar6;
          }
          local_88 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
          puVar9 = (ulong *)(plVar6 + 2);
          if ((ulong *)*plVar6 == puVar9) {
            local_c0 = *puVar9;
            lStack_b8 = plVar6[3];
            local_d0 = &local_c0;
          }
          else {
            local_c0 = *puVar9;
            local_d0 = (ulong *)*plVar6;
          }
          local_c8 = plVar6[1];
          *plVar6 = (long)puVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_f0);
          this = local_118;
          uVar10 = 0xf;
          if (local_d0 != &local_c0) {
            uVar10 = local_c0;
          }
          if (uVar10 < (ulong)(local_a8 + local_c8)) {
            uVar10 = 0xf;
            if (local_b0 != local_a0) {
              uVar10 = local_a0[0];
            }
            if (uVar10 < (ulong)(local_a8 + local_c8)) goto LAB_00272b0f;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
          }
          else {
LAB_00272b0f:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
          }
          psVar1 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_110.field_2._M_allocated_capacity = *psVar1;
            local_110.field_2._8_8_ = puVar7[3];
            local_110._M_dataplus._M_p = (pointer)((long)&local_110 + 0x10U);
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar1;
            local_110._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_110._M_string_length = puVar7[1];
          *puVar7 = psVar1;
          puVar7[1] = 0;
          *(undefined1 *)psVar1 = 0;
          std::__cxx11::string::operator=((string *)local_138,(string *)&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_110 + 0x10U)) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          if (local_b0 != local_a0) {
            operator_delete(local_b0);
          }
          if (local_d0 != &local_c0) {
            operator_delete(local_d0);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
        }
        io::Printer::Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string>
                  (this->printer_,"$statement$ as $alias$\n",(char (*) [10])"statement",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   (char (*) [6])0x3a48c7,&local_70);
        if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_);
        }
      }
      pFVar3 = FileDescriptor::dependency(this->file_,index);
      CopyPublicDependenciesAliases(this,&local_70,pFVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      index = index + 1;
      pFVar3 = this->file_;
    } while (index < *(int *)(pFVar3 + 0x20));
  }
  io::Printer::Print<>(this->printer_,"\n");
  pFVar3 = this->file_;
  if (0 < *(int *)(pFVar3 + 0x24)) {
    lVar11 = 0;
    do {
      pFVar3 = FileDescriptor::dependency(pFVar3,*(int *)(*(long *)(pFVar3 + 0x58) + lVar11 * 4));
      anon_unknown_0::ModuleName(&local_f0,*(string **)pFVar3);
      io::Printer::Print<char[7],std::__cxx11::string>
                (this->printer_,"from $module$ import *\n",(char (*) [7])"module",&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      lVar11 = lVar11 + 1;
      pFVar3 = this->file_;
    } while (lVar11 < *(int *)(pFVar3 + 0x24));
  }
  io::Printer::Print<>(this->printer_,"\n");
  return;
}

Assistant:

void Generator::PrintImports() const {
  for (int i = 0; i < file_->dependency_count(); ++i) {
    const std::string& filename = file_->dependency(i)->name();

    std::string module_name = ModuleName(filename);
    std::string module_alias = ModuleAlias(filename);
    if (ContainsPythonKeyword(module_name)) {
      // If the module path contains a Python keyword, we have to quote the
      // module name and import it using importlib. Otherwise the usual kind of
      // import statement would result in a syntax error from the presence of
      // the keyword.
      printer_->Print("import importlib\n");
      printer_->Print("$alias$ = importlib.import_module('$name$')\n", "alias",
                      module_alias, "name", module_name);
    } else {
      int last_dot_pos = module_name.rfind('.');
      std::string import_statement;
      if (last_dot_pos == std::string::npos) {
        // NOTE(petya): this is not tested as it would require a protocol buffer
        // outside of any package, and I don't think that is easily achievable.
        import_statement = "import " + module_name;
      } else {
        import_statement = "from " + module_name.substr(0, last_dot_pos) +
                           " import " + module_name.substr(last_dot_pos + 1);
      }
      printer_->Print("$statement$ as $alias$\n", "statement", import_statement,
                      "alias", module_alias);
    }

    CopyPublicDependenciesAliases(module_alias, file_->dependency(i));
  }
  printer_->Print("\n");

  // Print public imports.
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    std::string module_name = ModuleName(file_->public_dependency(i)->name());
    printer_->Print("from $module$ import *\n", "module", module_name);
  }
  printer_->Print("\n");
}